

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void hwnet::ThreadPool::threadFunc(TaskQueue *queue_)

{
  bool bVar1;
  element_type *peVar2;
  undefined1 local_20 [8];
  Ptr task;
  TaskQueue *queue__local;
  
  task.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)queue_;
  do {
    TaskQueue::Get((TaskQueue *)local_20);
    bVar1 = std::operator==((shared_ptr<hwnet::Task> *)local_20,(nullptr_t)0x0);
    if (!bVar1) {
      peVar2 = std::__shared_ptr_access<hwnet::Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      (**peVar2->_vptr_Task)();
    }
    std::shared_ptr<hwnet::Task>::~shared_ptr((shared_ptr<hwnet::Task> *)local_20);
  } while (!bVar1);
  return;
}

Assistant:

void ThreadPool::threadFunc(ThreadPool::TaskQueue *queue_) {
	for(;;) {
		Task::Ptr task = queue_->Get();
		if(task == nullptr) {
			return;
		}
		task->Do();
	}
}